

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int get_drl_cost(PREDICTION_MODE this_mode,int ref_mv_idx,MB_MODE_INFO_EXT *mbmi_ext,
                int (*drl_mode_cost0) [2],int8_t ref_frame_type)

{
  byte bVar1;
  int iVar2;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  PREDICTION_MODE in_DIL;
  char in_R8B;
  uint8_t drl_ctx_1;
  int idx_1;
  uint8_t drl_ctx;
  int idx;
  int cost;
  int local_34;
  int local_2c;
  int local_28;
  int local_4;
  
  local_28 = 0;
  if ((in_DIL == '\x10') || (in_DIL == '\x18')) {
    for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
      if (local_2c + 1 < (int)(uint)*(byte *)(in_RDX + 0x488 + (long)in_R8B)) {
        bVar1 = av1_drl_ctx((uint16_t *)(in_RDX + 0x3a0 + (long)in_R8B * 8),local_2c);
        local_28 = *(int *)(in_RCX + (ulong)bVar1 * 8 + (long)(int)(uint)(in_ESI != local_2c) * 4) +
                   local_28;
        if (in_ESI == local_2c) {
          return local_28;
        }
      }
    }
    local_4 = local_28;
  }
  else {
    iVar2 = have_nearmv_in_inter_mode(in_DIL);
    if (iVar2 == 0) {
      local_4 = 0;
    }
    else {
      for (local_34 = 1; local_34 < 3; local_34 = local_34 + 1) {
        if (local_34 + 1 < (int)(uint)*(byte *)(in_RDX + 0x488 + (long)in_R8B)) {
          bVar1 = av1_drl_ctx((uint16_t *)(in_RDX + 0x3a0 + (long)in_R8B * 8),local_34);
          local_28 = *(int *)(in_RCX + (ulong)bVar1 * 8 +
                             (long)(int)(uint)(in_ESI != local_34 + -1) * 4) + local_28;
          if (in_ESI == local_34 + -1) {
            return local_28;
          }
        }
      }
      local_4 = local_28;
    }
  }
  return local_4;
}

Assistant:

static inline int get_drl_cost(const MB_MODE_INFO *mbmi,
                               const MB_MODE_INFO_EXT *mbmi_ext,
                               const int (*const drl_mode_cost0)[2],
                               int8_t ref_frame_type) {
  int cost = 0;
  if (mbmi->mode == NEWMV || mbmi->mode == NEW_NEWMV) {
    for (int idx = 0; idx < 2; ++idx) {
      if (mbmi_ext->ref_mv_count[ref_frame_type] > idx + 1) {
        uint8_t drl_ctx = av1_drl_ctx(mbmi_ext->weight[ref_frame_type], idx);
        cost += drl_mode_cost0[drl_ctx][mbmi->ref_mv_idx != idx];
        if (mbmi->ref_mv_idx == idx) return cost;
      }
    }
    return cost;
  }

  if (have_nearmv_in_inter_mode(mbmi->mode)) {
    for (int idx = 1; idx < 3; ++idx) {
      if (mbmi_ext->ref_mv_count[ref_frame_type] > idx + 1) {
        uint8_t drl_ctx = av1_drl_ctx(mbmi_ext->weight[ref_frame_type], idx);
        cost += drl_mode_cost0[drl_ctx][mbmi->ref_mv_idx != (idx - 1)];
        if (mbmi->ref_mv_idx == (idx - 1)) return cost;
      }
    }
    return cost;
  }
  return cost;
}